

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_msg_dup(nni_msg **dup,nni_msg *src)

{
  nni_msg *__dest;
  int rv;
  nni_msg *m;
  nni_msg *src_local;
  nni_msg **dup_local;
  
  __dest = (nni_msg *)nni_zalloc(0xf8);
  if (__dest == (nni_msg *)0x0) {
    dup_local._4_4_ = 2;
  }
  else {
    memcpy(__dest,src,src->m_header_len);
    __dest->m_header_len = src->m_header_len;
    dup_local._4_4_ = nni_chunk_dup(&__dest->m_body,&src->m_body);
    if (dup_local._4_4_ == 0) {
      __dest->m_pipe = src->m_pipe;
      nni_atomic_init(&__dest->m_refcnt);
      nni_atomic_set(&__dest->m_refcnt,1);
      *dup = __dest;
      dup_local._4_4_ = 0;
    }
    else {
      nni_free(__dest,0xf8);
    }
  }
  return dup_local._4_4_;
}

Assistant:

int
nni_msg_dup(nni_msg **dup, const nni_msg *src)
{
	nni_msg *m;
	int      rv;

	if ((m = NNI_ALLOC_STRUCT(m)) == NULL) {
		return (NNG_ENOMEM);
	}

	memcpy(m->m_header_buf, src->m_header_buf, src->m_header_len);
	m->m_header_len = src->m_header_len;

	if ((rv = nni_chunk_dup(&m->m_body, &src->m_body)) != 0) {
		NNI_FREE_STRUCT(m);
		return (rv);
	}

	m->m_pipe = src->m_pipe;
	nni_atomic_init(&m->m_refcnt);
	nni_atomic_set(&m->m_refcnt, 1);

	*dup = m;
	return (0);
}